

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O1

void __thiscall tcu::x11::XlibWindow::~XlibWindow(XlibWindow *this)

{
  ~XlibWindow(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

XlibWindow::~XlibWindow (void)
{
	XDestroyWindow(m_display.getXDisplay(), m_window);
	if (m_colormap != None)
		XFreeColormap(m_display.getXDisplay(), m_colormap);
}